

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::trace_extracted_demand
          (mchain_tracing_enabled_base *this,abstract_message_chain_t *chain,demand_t *d)

{
  tracer_t *tracer;
  composed_action_name local_30;
  demand_t *local_20;
  demand_t *d_local;
  abstract_message_chain_t *chain_local;
  mchain_tracing_enabled_base *this_local;
  
  tracer = this->m_tracer;
  local_20 = d;
  d_local = (demand_t *)chain;
  chain_local = (abstract_message_chain_t *)this;
  local_30.m_1 = message_or_svc_request(d->m_demand_type);
  local_30.m_2 = "extracted";
  details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (tracer,chain,&local_30,&local_20->m_msg_type,&local_20->m_message_ref);
  return;
}

Assistant:

void
		trace_extracted_demand(
			const abstract_message_chain_t & chain,
			const mchain_props::demand_t & d )
			{
				details::make_trace(
						m_tracer,
						chain,
						details::composed_action_name{
								message_or_svc_request( d.m_demand_type ),
								"extracted" },
						d.m_msg_type,
						d.m_message_ref );
			}